

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

qpTestResult __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::ValidateFramebuffer
          (ClipControlDepthModeZeroToOneTest *this,Context *context)

{
  RenderContext *pRVar1;
  TestLog *log;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  int iVar5;
  qpTestResult qVar6;
  int y;
  int x;
  float fVar7;
  float fVar8;
  Surface renderedColorFrame;
  TextureFormat depthFormat;
  Surface referenceColorFrame;
  TextureLevel importanceMaskFrame;
  TextureLevel referenceDepthFrame;
  TextureLevel renderedDepthFrame;
  Surface local_138;
  double local_120;
  TextureFormat local_118;
  ClipControlDepthModeZeroToOneTest *local_110;
  TestLog *local_108;
  double local_100;
  double local_f8;
  Surface local_f0;
  TextureFormat local_d8;
  PixelBufferAccess local_d0;
  TextureLevel local_a8;
  TextureLevel local_80;
  TextureLevel local_58;
  
  local_110 = this;
  iVar3 = (*context->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar3 = ((int *)CONCAT44(extraout_var,iVar3))[1];
  tcu::Surface::Surface(&local_138,iVar5,iVar3);
  tcu::Surface::Surface(&local_f0,iVar5,iVar3);
  local_118.order = D;
  local_118.type = FLOAT;
  tcu::TextureLevel::TextureLevel(&local_58,&local_118,iVar5,iVar3,1);
  tcu::TextureLevel::TextureLevel(&local_80,&local_118,iVar5,iVar3,1);
  tcu::TextureLevel::TextureLevel(&local_a8,&local_118,iVar5,iVar3,1);
  local_108 = context->m_testCtx->m_log;
  iVar5 = local_138.m_width;
  iVar3 = local_138.m_height;
  if (0 < local_138.m_height) {
    local_100 = (double)(2.0 / (float)local_138.m_width + 2.0 / (float)local_138.m_height);
    y = 0;
    do {
      if (0 < iVar5) {
        fVar7 = ((float)y + 0.5) / (float)iVar3;
        local_120 = (double)fVar7;
        x = 0;
        do {
          fVar8 = ((float)x + 0.5) / (float)iVar5;
          local_f8 = 1.0 - (double)fVar8;
          if ((local_120 < local_f8 - local_100) || (local_f8 + local_100 < local_120)) {
            tcu::TextureLevel::getAccess(&local_d0,&local_a8);
            tcu::PixelBufferAccess::setPixDepth(&local_d0,1.0,x,y,0);
          }
          else {
            tcu::TextureLevel::getAccess(&local_d0,&local_a8);
            tcu::PixelBufferAccess::setPixDepth(&local_d0,0.0,x,y,0);
          }
          lVar4 = (long)(local_f0.m_width * y + x);
          if (local_f8 <= local_120) {
            *(undefined4 *)((long)local_f0.m_pixels.m_ptr + lVar4 * 4) = 0xff00ff00;
            tcu::TextureLevel::getAccess(&local_d0,&local_80);
            tcu::PixelBufferAccess::setPixDepth(&local_d0,fVar8 + -1.0 + fVar7,x,y,0);
          }
          else {
            *(undefined4 *)((long)local_f0.m_pixels.m_ptr + lVar4 * 4) = 0xff0000ff;
            tcu::TextureLevel::getAccess(&local_d0,&local_80);
            tcu::PixelBufferAccess::setPixDepth(&local_d0,0.5,x,y,0);
          }
          x = x + 1;
          iVar5 = local_138.m_width;
          iVar3 = local_138.m_height;
        } while (x < local_138.m_width);
      }
      y = y + 1;
    } while (y < iVar3);
  }
  pRVar1 = context->m_renderCtx;
  local_d8.order = RGBA;
  local_d8.type = UNORM_INT8;
  if ((void *)local_138.m_pixels.m_cap != (void *)0x0) {
    local_138.m_pixels.m_cap = (size_t)local_138.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_d0,&local_d8,iVar5,iVar3,1,(void *)local_138.m_pixels.m_cap);
  log = local_108;
  glu::readPixels(pRVar1,0,0,&local_d0);
  qVar6 = QP_TEST_RESULT_FAIL;
  bVar2 = tcu::fuzzyCompare(log,"Result","Color image comparison result",&local_f0,&local_138,0.05,
                            COMPARE_LOG_RESULT);
  if (bVar2) {
    pRVar1 = context->m_renderCtx;
    tcu::TextureLevel::getAccess(&local_d0,&local_58);
    glu::readPixels(pRVar1,0,0,&local_d0);
    bVar2 = ClipControlRenderBaseTest::fuzzyDepthCompare
                      (&local_110->super_ClipControlRenderBaseTest,log,"Result",
                       "Depth image comparison result",&local_80,&local_58,0.05,&local_a8);
    qVar6 = (qpTestResult)!bVar2;
  }
  tcu::TextureLevel::~TextureLevel(&local_a8);
  tcu::TextureLevel::~TextureLevel(&local_80);
  tcu::TextureLevel::~TextureLevel(&local_58);
  tcu::Surface::~Surface(&local_f0);
  tcu::Surface::~Surface(&local_138);
  return qVar6;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedColorFrame(viewportW, viewportH);
		tcu::Surface			 referenceColorFrame(viewportW, viewportH);
		tcu::TextureFormat		 depthFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
		tcu::TextureLevel		 renderedDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 referenceDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 importanceMaskFrame(depthFormat, viewportW, viewportH);

		tcu::TestLog& log = context.getTestContext().getLog();

		const float rasterizationError =
			2.0f / (float)renderedColorFrame.getHeight() + 2.0f / (float)renderedColorFrame.getWidth();

		for (int y = 0; y < renderedColorFrame.getHeight(); y++)
		{
			float yCoord = ((float)(y) + 0.5f) / (float)renderedColorFrame.getHeight();

			for (int x = 0; x < renderedColorFrame.getWidth(); x++)
			{
				float xCoord = ((float)(x) + 0.5f) / (float)renderedColorFrame.getWidth();

				if (yCoord >= 1.0 - xCoord - rasterizationError && yCoord <= 1.0 - xCoord + rasterizationError)
				{
					importanceMaskFrame.getAccess().setPixDepth(0.0f, x, y);
				}
				else
				{
					importanceMaskFrame.getAccess().setPixDepth(1.0f, x, y);
				}

				if (yCoord < 1.0 - xCoord)
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::red());
					referenceDepthFrame.getAccess().setPixDepth(0.5f, x, y);
				}
				else
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::green());

					referenceDepthFrame.getAccess().setPixDepth(-1.0f + xCoord + yCoord, x, y);
				}
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedColorFrame.getAccess());
		if (!tcu::fuzzyCompare(log, "Result", "Color image comparison result", referenceColorFrame, renderedColorFrame,
							   0.05f, tcu::COMPARE_LOG_RESULT))
		{

			return QP_TEST_RESULT_FAIL;
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedDepthFrame.getAccess());
		if (!fuzzyDepthCompare(log, "Result", "Depth image comparison result", referenceDepthFrame, renderedDepthFrame,
							   0.05f, &importanceMaskFrame))
		{
			return QP_TEST_RESULT_FAIL;
		}
		return QP_TEST_RESULT_PASS;
	}